

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optim_mir.cpp
# Opt level: O2

void push(VarId *a)

{
  std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::push_back(&V,a);
  return;
}

Assistant:

void push(mir::inst::VarId a) { V.push_back(a); }